

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O3

void __thiscall QPDFJob::doJSONEncrypt(QPDFJob *this,Pipeline *p,bool *first,QPDF *pdf)

{
  element_type *peVar1;
  element_type *peVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  element_type *peVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  undefined8 uVar5;
  bool value;
  bool bVar6;
  char *pcVar7;
  longlong value_00;
  string s_stream_method;
  string MODIFY_ANNOTATIONS;
  string s_string_method;
  encryption_method_e file_method;
  encryption_method_e string_method;
  encryption_method_e stream_method;
  JSON j_parameters;
  JSON j_capabilities;
  int V;
  JSON j_encrypt;
  int P;
  int R;
  string s_file_method;
  string s_overall_method;
  undefined1 local_2d8 [32];
  undefined1 local_2b8 [32];
  undefined1 local_298 [32];
  encryption_method_e local_278;
  encryption_method_e local_274;
  JSON local_270;
  encryption_method_e local_25c;
  undefined1 local_258 [32];
  undefined1 local_238 [36];
  int local_214;
  string local_210;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_1f0;
  undefined1 local_1e8 [32];
  bool *local_1c8;
  string local_1c0;
  JSON local_1a0;
  JSON local_190;
  JSON local_180;
  JSON local_170;
  JSON local_160;
  JSON local_150;
  JSON local_140;
  JSON local_130;
  JSON local_120;
  JSON local_110;
  JSON local_100;
  JSON local_f0;
  JSON local_e0;
  JSON local_d0;
  JSON local_c0;
  JSON local_b0;
  JSON local_a0;
  JSON local_90;
  JSON local_80;
  JSON local_70;
  JSON local_60;
  JSON local_50;
  JSON local_40;
  
  local_210.field_2._M_allocated_capacity._4_4_ = 0;
  local_210.field_2._M_allocated_capacity._0_4_ = 0;
  local_214 = 0;
  local_25c = e_none;
  local_274 = e_none;
  local_278 = e_none;
  local_1c8 = first;
  value = QPDF::isEncrypted(pdf,(int *)(local_210.field_2._M_local_buf + 4),
                            (int *)local_210.field_2._M_local_buf,&local_214,&local_25c,&local_274,
                            &local_278);
  JSON::makeDictionary();
  peVar1 = (element_type *)(local_2b8 + 0x10);
  local_2b8._0_8_ = peVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"encrypted","");
  JSON::makeBool((JSON *)local_2d8,value);
  JSON::addDictionaryMember(&local_40,&local_210,(JSON *)local_2b8);
  if (local_40.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_);
  }
  if ((element_type *)local_2b8._0_8_ != peVar1) {
    operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ + 1);
  }
  local_2b8._0_8_ = peVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"userpasswordmatched","");
  if (value) {
    bVar6 = QPDF::userPasswordMatched(pdf);
  }
  else {
    bVar6 = false;
  }
  JSON::makeBool((JSON *)local_2d8,bVar6);
  JSON::addDictionaryMember(&local_50,&local_210,(JSON *)local_2b8);
  if (local_50.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_);
  }
  if ((element_type *)local_2b8._0_8_ != peVar1) {
    operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ + 1);
  }
  local_2b8._0_8_ = peVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"ownerpasswordmatched","");
  if (value) {
    bVar6 = QPDF::ownerPasswordMatched(pdf);
  }
  else {
    bVar6 = false;
  }
  JSON::makeBool((JSON *)local_2d8,bVar6);
  JSON::addDictionaryMember(&local_60,&local_210,(JSON *)local_2b8);
  if (local_60.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_);
  }
  if ((element_type *)local_2b8._0_8_ != peVar1) {
    operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ + 1);
  }
  if (local_214 < 5 && value) {
    bVar6 = QPDF::ownerPasswordMatched(pdf);
    if (bVar6) {
      bVar6 = QPDF::userPasswordMatched(pdf);
      if (!bVar6) {
        QPDF::getTrimmedUserPassword_abi_cxx11_((string *)local_2b8,pdf);
        local_2d8._0_8_ = (element_type *)(local_2d8 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_2d8,"recovereduserpassword","");
        JSON::makeString((JSON *)local_298,(string *)local_2b8);
        JSON::addDictionaryMember(&local_70,&local_210,(JSON *)local_2d8);
        if (local_70.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_70.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298._8_8_);
        }
        if ((element_type *)local_2d8._0_8_ != (element_type *)(local_2d8 + 0x10)) {
          operator_delete((void *)local_2d8._0_8_,local_2d8._16_8_ + 1);
        }
        goto LAB_0017e42a;
      }
    }
  }
  local_2b8._0_8_ = peVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"recovereduserpassword","");
  JSON::makeNull();
  JSON::addDictionaryMember(&local_80,&local_210,(JSON *)local_2b8);
  if (local_80.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_80.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_);
  }
LAB_0017e42a:
  if ((element_type *)local_2b8._0_8_ != peVar1) {
    operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ + 1);
  }
  local_2b8._0_8_ = peVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"capabilities","");
  JSON::makeDictionary();
  JSON::addDictionaryMember((JSON *)(local_238 + 0x10),&local_210,(JSON *)local_2b8);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_);
  }
  if ((element_type *)local_2b8._0_8_ != peVar1) {
    operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ + 1);
  }
  local_2b8._0_8_ = peVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"accessibility","");
  bVar6 = QPDF::allowAccessibility(pdf);
  JSON::makeBool((JSON *)local_2d8,bVar6);
  JSON::addDictionaryMember(&local_90,(string *)(local_238 + 0x10),(JSON *)local_2b8);
  if (local_90.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_90.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_);
  }
  if ((element_type *)local_2b8._0_8_ != peVar1) {
    operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ + 1);
  }
  local_2b8._0_8_ = peVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"extract","");
  bVar6 = QPDF::allowExtractAll(pdf);
  JSON::makeBool((JSON *)local_2d8,bVar6);
  JSON::addDictionaryMember(&local_a0,(string *)(local_238 + 0x10),(JSON *)local_2b8);
  if (local_a0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_a0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_);
  }
  if ((element_type *)local_2b8._0_8_ != peVar1) {
    operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ + 1);
  }
  local_2b8._0_8_ = peVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"printlow","");
  bVar6 = QPDF::allowPrintLowRes(pdf);
  JSON::makeBool((JSON *)local_2d8,bVar6);
  JSON::addDictionaryMember(&local_b0,(string *)(local_238 + 0x10),(JSON *)local_2b8);
  if (local_b0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_b0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_);
  }
  if ((element_type *)local_2b8._0_8_ != peVar1) {
    operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ + 1);
  }
  local_2b8._0_8_ = peVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"printhigh","");
  bVar6 = QPDF::allowPrintHighRes(pdf);
  JSON::makeBool((JSON *)local_2d8,bVar6);
  JSON::addDictionaryMember(&local_c0,(string *)(local_238 + 0x10),(JSON *)local_2b8);
  if (local_c0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_c0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_);
  }
  if ((element_type *)local_2b8._0_8_ != peVar1) {
    operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ + 1);
  }
  local_2b8._0_8_ = peVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"modifyassembly","");
  bVar6 = QPDF::allowModifyAssembly(pdf);
  JSON::makeBool((JSON *)local_2d8,bVar6);
  JSON::addDictionaryMember(&local_d0,(string *)(local_238 + 0x10),(JSON *)local_2b8);
  if (local_d0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_);
  }
  if ((element_type *)local_2b8._0_8_ != peVar1) {
    operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ + 1);
  }
  local_2b8._0_8_ = peVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2b8,"modifyforms","");
  bVar6 = QPDF::allowModifyForm(pdf);
  JSON::makeBool((JSON *)local_2d8,bVar6);
  JSON::addDictionaryMember(&local_e0,(string *)(local_238 + 0x10),(JSON *)local_2b8);
  if (local_e0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_);
  }
  if ((element_type *)local_2b8._0_8_ != peVar1) {
    operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ + 1);
  }
  bVar6 = ((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          json_version == 1;
  pcVar7 = "modifyannotations";
  if (bVar6) {
    pcVar7 = "moddifyannotations";
  }
  local_2b8._0_8_ = peVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_2b8,pcVar7,pcVar7 + (ulong)bVar6 + 0x11);
  bVar6 = QPDF::allowModifyAnnotation(pdf);
  JSON::makeBool((JSON *)local_2d8,bVar6);
  JSON::addDictionaryMember(&local_f0,(string *)(local_238 + 0x10),(JSON *)local_2b8);
  if (local_f0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2d8._8_8_);
  }
  peVar2 = (element_type *)(local_2d8 + 0x10);
  local_2d8._0_8_ = peVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"modifyother","");
  bVar6 = QPDF::allowModifyOther(pdf);
  JSON::makeBool((JSON *)local_298,bVar6);
  JSON::addDictionaryMember(&local_100,(string *)(local_238 + 0x10),(JSON *)local_2d8);
  if (local_100.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_100.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298._8_8_);
  }
  if ((element_type *)local_2d8._0_8_ != peVar2) {
    operator_delete((void *)local_2d8._0_8_,local_2d8._16_8_ + 1);
  }
  local_2d8._0_8_ = peVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"modify","");
  bVar6 = QPDF::allowModifyAll(pdf);
  JSON::makeBool((JSON *)local_298,bVar6);
  JSON::addDictionaryMember(&local_110,(string *)(local_238 + 0x10),(JSON *)local_2d8);
  if (local_110.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_110.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298._8_8_);
  }
  if ((element_type *)local_2d8._0_8_ != peVar2) {
    operator_delete((void *)local_2d8._0_8_,local_2d8._16_8_ + 1);
  }
  local_2d8._0_8_ = peVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"parameters","");
  JSON::makeDictionary();
  JSON::addDictionaryMember((JSON *)local_238,&local_210,(JSON *)local_2d8);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298._8_8_);
  }
  if ((element_type *)local_2d8._0_8_ != peVar2) {
    operator_delete((void *)local_2d8._0_8_,local_2d8._16_8_ + 1);
  }
  local_2d8._0_8_ = peVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"R","");
  JSON::makeInt((JSON *)local_298,(long)(int)local_210.field_2._M_allocated_capacity._4_4_);
  JSON::addDictionaryMember(&local_120,(string *)local_238,(JSON *)local_2d8);
  if (local_120.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_120.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298._8_8_);
  }
  if ((element_type *)local_2d8._0_8_ != peVar2) {
    operator_delete((void *)local_2d8._0_8_,local_2d8._16_8_ + 1);
  }
  local_2d8._0_8_ = peVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"V","");
  JSON::makeInt((JSON *)local_298,(long)local_214);
  JSON::addDictionaryMember(&local_130,(string *)local_238,(JSON *)local_2d8);
  if (local_130.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_130.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298._8_8_);
  }
  if ((element_type *)local_2d8._0_8_ != peVar2) {
    operator_delete((void *)local_2d8._0_8_,local_2d8._16_8_ + 1);
  }
  local_2d8._0_8_ = peVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"P","");
  JSON::makeInt((JSON *)local_298,(long)(int)local_210.field_2._M_allocated_capacity._0_4_);
  JSON::addDictionaryMember(&local_140,(string *)local_238,(JSON *)local_2d8);
  if (local_140.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_140.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298._8_8_);
  }
  if ((element_type *)local_2d8._0_8_ != peVar2) {
    operator_delete((void *)local_2d8._0_8_,local_2d8._16_8_ + 1);
  }
  JSON::makeNull();
  if (value) {
    QPDF::getEncryptionKey_abi_cxx11_((string *)local_2d8,pdf);
    if ((local_2d8._8_8_ * 8 & 0xffffffff80000000U) != 0) {
      QIntC::IntConverter<unsigned_long,_int,_false,_true>::error(local_2d8._8_8_ * 8);
    }
    if (((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        show_encryption_key == true) {
      QUtil::hex_encode((string *)local_298,(string *)local_2d8);
      JSON::makeString((JSON *)local_1e8,(string *)local_298);
      uVar5 = local_1e8._8_8_;
      local_210.field_2._8_8_ = local_1e8._0_8_;
      this_00 = p_Stack_1f0;
      local_1e8._0_8_ = (element_type *)0x0;
      local_1e8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Stack_1f0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1e8._8_8_);
        }
      }
      if ((element_type *)local_298._0_8_ != (element_type *)(local_298 + 0x10)) {
        operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
      }
    }
    if ((element_type *)local_2d8._0_8_ != peVar2) {
      operator_delete((void *)local_2d8._0_8_,local_2d8._16_8_ + 1);
    }
    value_00 = (long)(local_2d8._8_8_ << 0x23) >> 0x20;
  }
  else {
    value_00 = 0;
  }
  local_2d8._0_8_ = peVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"bits","");
  JSON::makeInt((JSON *)local_298,value_00);
  JSON::addDictionaryMember(&local_150,(string *)local_238,(JSON *)local_2d8);
  if (local_150.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_150.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298._8_8_);
  }
  if ((element_type *)local_2d8._0_8_ != peVar2) {
    operator_delete((void *)local_2d8._0_8_,local_2d8._16_8_ + 1);
  }
  local_2d8._0_8_ = peVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2d8,"key","");
  JSON::addDictionaryMember(&local_160,(string *)local_238,(JSON *)local_2d8);
  if (local_160.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_160.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  if ((element_type *)local_2d8._0_8_ != peVar2) {
    operator_delete((void *)local_2d8._0_8_,local_2d8._16_8_ + 1);
  }
  if (local_25c == e_none && value) {
    local_25c = e_rc4;
  }
  if (local_274 == e_none && value) {
    local_274 = e_rc4;
  }
  if (value && local_278 == e_none) {
    local_278 = e_rc4;
  }
  show_encryption_method_abi_cxx11_((string *)local_2d8,local_25c);
  show_encryption_method_abi_cxx11_((string *)local_298,local_274);
  show_encryption_method_abi_cxx11_((string *)local_1e8,local_278);
  paVar3 = &local_1c0.field_2;
  local_1c0._M_string_length = 0;
  local_1c0.field_2._M_local_buf[0] = '\0';
  local_1c0._M_dataplus._M_p = (pointer)paVar3;
  if ((local_25c == local_274) && (local_25c == local_278)) {
    std::__cxx11::string::_M_assign((string *)&local_1c0);
  }
  else {
    std::__cxx11::string::_M_replace((ulong)&local_1c0,0,(char *)0x0,0x26bf6f);
  }
  peVar4 = (element_type *)(local_258 + 0x10);
  local_258._0_8_ = peVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"method","");
  JSON::makeString(&local_270,&local_1c0);
  JSON::addDictionaryMember(&local_170,(string *)local_238,(JSON *)local_258);
  if (local_170.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  if (local_270.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_270.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  if ((element_type *)local_258._0_8_ != peVar4) {
    operator_delete((void *)local_258._0_8_,local_258._16_8_ + 1);
  }
  local_258._0_8_ = peVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"streammethod","");
  JSON::makeString(&local_270,(string *)local_2d8);
  JSON::addDictionaryMember(&local_180,(string *)local_238,(JSON *)local_258);
  if (local_180.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_180.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  if (local_270.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_270.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  if ((element_type *)local_258._0_8_ != peVar4) {
    operator_delete((void *)local_258._0_8_,local_258._16_8_ + 1);
  }
  local_258._0_8_ = peVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"stringmethod","");
  JSON::makeString(&local_270,(string *)local_298);
  JSON::addDictionaryMember(&local_190,(string *)local_238,(JSON *)local_258);
  if (local_190.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_190.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  if (local_270.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_270.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  if ((element_type *)local_258._0_8_ != peVar4) {
    operator_delete((void *)local_258._0_8_,local_258._16_8_ + 1);
  }
  local_258._0_8_ = peVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"filemethod","");
  JSON::makeString(&local_270,(string *)local_1e8);
  JSON::addDictionaryMember(&local_1a0,(string *)local_238,(JSON *)local_258);
  if (local_1a0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1a0.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  if (local_270.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_270.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi);
  }
  if ((element_type *)local_258._0_8_ != peVar4) {
    operator_delete((void *)local_258._0_8_,local_258._16_8_ + 1);
  }
  local_258._0_8_ = peVar4;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"encrypt","");
  JSON::writeDictionaryItem(p,local_1c8,(string *)local_258,(JSON *)&local_210,1);
  if ((element_type *)local_258._0_8_ != peVar4) {
    operator_delete((void *)local_258._0_8_,local_258._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != paVar3) {
    operator_delete(local_1c0._M_dataplus._M_p,
                    CONCAT71(local_1c0.field_2._M_allocated_capacity._1_7_,
                             local_1c0.field_2._M_local_buf[0]) + 1);
  }
  if ((element_type *)local_1e8._0_8_ != (element_type *)(local_1e8 + 0x10)) {
    operator_delete((void *)local_1e8._0_8_,local_1e8._16_8_ + 1);
  }
  if ((element_type *)local_298._0_8_ != (element_type *)(local_298 + 0x10)) {
    operator_delete((void *)local_298._0_8_,local_298._16_8_ + 1);
  }
  if ((element_type *)local_2d8._0_8_ != peVar2) {
    operator_delete((void *)local_2d8._0_8_,local_2d8._16_8_ + 1);
  }
  if (p_Stack_1f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1f0);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._8_8_);
  }
  if ((element_type *)local_2b8._0_8_ != peVar1) {
    operator_delete((void *)local_2b8._0_8_,local_2b8._16_8_ + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._24_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._24_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_210._M_string_length !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_210._M_string_length);
  }
  return;
}

Assistant:

void
QPDFJob::doJSONEncrypt(Pipeline* p, bool& first, QPDF& pdf)
{
    int R = 0;
    int P = 0;
    int V = 0;
    QPDF::encryption_method_e stream_method = QPDF::e_none;
    QPDF::encryption_method_e string_method = QPDF::e_none;
    QPDF::encryption_method_e file_method = QPDF::e_none;
    bool is_encrypted = pdf.isEncrypted(R, P, V, stream_method, string_method, file_method);
    JSON j_encrypt = JSON::makeDictionary();
    j_encrypt.addDictionaryMember("encrypted", JSON::makeBool(is_encrypted));
    j_encrypt.addDictionaryMember(
        "userpasswordmatched", JSON::makeBool(is_encrypted && pdf.userPasswordMatched()));
    j_encrypt.addDictionaryMember(
        "ownerpasswordmatched", JSON::makeBool(is_encrypted && pdf.ownerPasswordMatched()));
    if (is_encrypted && (V < 5) && pdf.ownerPasswordMatched() && (!pdf.userPasswordMatched())) {
        std::string user_password = pdf.getTrimmedUserPassword();
        j_encrypt.addDictionaryMember("recovereduserpassword", JSON::makeString(user_password));
    } else {
        j_encrypt.addDictionaryMember("recovereduserpassword", JSON::makeNull());
    }
    JSON j_capabilities = j_encrypt.addDictionaryMember("capabilities", JSON::makeDictionary());
    j_capabilities.addDictionaryMember("accessibility", JSON::makeBool(pdf.allowAccessibility()));
    j_capabilities.addDictionaryMember("extract", JSON::makeBool(pdf.allowExtractAll()));
    j_capabilities.addDictionaryMember("printlow", JSON::makeBool(pdf.allowPrintLowRes()));
    j_capabilities.addDictionaryMember("printhigh", JSON::makeBool(pdf.allowPrintHighRes()));
    j_capabilities.addDictionaryMember("modifyassembly", JSON::makeBool(pdf.allowModifyAssembly()));
    j_capabilities.addDictionaryMember("modifyforms", JSON::makeBool(pdf.allowModifyForm()));
    /* cSpell:ignore moddifyannotations */
    std::string MODIFY_ANNOTATIONS =
        (m->json_version == 1 ? "moddifyannotations" : "modifyannotations");
    j_capabilities.addDictionaryMember(
        MODIFY_ANNOTATIONS, JSON::makeBool(pdf.allowModifyAnnotation()));
    j_capabilities.addDictionaryMember("modifyother", JSON::makeBool(pdf.allowModifyOther()));
    j_capabilities.addDictionaryMember("modify", JSON::makeBool(pdf.allowModifyAll()));
    JSON j_parameters = j_encrypt.addDictionaryMember("parameters", JSON::makeDictionary());
    j_parameters.addDictionaryMember("R", JSON::makeInt(R));
    j_parameters.addDictionaryMember("V", JSON::makeInt(V));
    j_parameters.addDictionaryMember("P", JSON::makeInt(P));
    int bits = 0;
    JSON key = JSON::makeNull();
    if (is_encrypted) {
        std::string encryption_key = pdf.getEncryptionKey();
        bits = QIntC::to_int(encryption_key.length() * 8);
        if (m->show_encryption_key) {
            key = JSON::makeString(QUtil::hex_encode(encryption_key));
        }
    }
    j_parameters.addDictionaryMember("bits", JSON::makeInt(bits));
    j_parameters.addDictionaryMember("key", key);
    auto fix_method = [is_encrypted](QPDF::encryption_method_e& method) {
        if (is_encrypted && method == QPDF::e_none) {
            method = QPDF::e_rc4;
        }
    };
    fix_method(stream_method);
    fix_method(string_method);
    fix_method(file_method);
    std::string s_stream_method = show_encryption_method(stream_method);
    std::string s_string_method = show_encryption_method(string_method);
    std::string s_file_method = show_encryption_method(file_method);
    std::string s_overall_method;
    if ((stream_method == string_method) && (stream_method == file_method)) {
        s_overall_method = s_stream_method;
    } else {
        s_overall_method = "mixed";
    }
    j_parameters.addDictionaryMember("method", JSON::makeString(s_overall_method));
    j_parameters.addDictionaryMember("streammethod", JSON::makeString(s_stream_method));
    j_parameters.addDictionaryMember("stringmethod", JSON::makeString(s_string_method));
    j_parameters.addDictionaryMember("filemethod", JSON::makeString(s_file_method));
    JSON::writeDictionaryItem(p, first, "encrypt", j_encrypt, 1);
}